

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rng.c
# Opt level: O0

void test_rng_free(void *vtest)

{
  void *in_RDI;
  PROV_TEST_RNG *t;
  
  if (in_RDI != (void *)0x0) {
    CRYPTO_free(*(void **)((long)in_RDI + 0x18));
    CRYPTO_free(*(void **)((long)in_RDI + 0x20));
    CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x34280f);
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void test_rng_free(void *vtest)
{
    PROV_TEST_RNG *t = (PROV_TEST_RNG *)vtest;

    if (t == NULL)
        return;
    OPENSSL_free(t->entropy);
    OPENSSL_free(t->nonce);
    CRYPTO_THREAD_lock_free(t->lock);
    OPENSSL_free(t);
}